

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O0

int SUNLogger_CreateFromEnv(void *comm,SUNLogger *logger)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char *debug_fname_env;
  char *info_fname_env;
  char *warning_fname_env;
  char *error_fname_env;
  int output_rank;
  char *output_rank_env;
  int retval;
  SUNLogger in_stack_ffffffffffffffa8;
  
  pcVar7 = getenv("SUNLOGGER_OUTPUT_RANK");
  if (pcVar7 == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = atoi(pcVar7);
  }
  getenv("SUNLOGGER_ERROR_FILENAME");
  getenv("SUNLOGGER_WARNING_FILENAME");
  getenv("SUNLOGGER_INFO_FILENAME");
  pcVar7 = getenv("SUNLOGGER_DEBUG_FILENAME");
  iVar1 = SUNLogger_Create(pcVar7,iVar1,(SUNLogger *)in_stack_ffffffffffffffa8);
  iVar2 = SUNLogger_SetErrorFilename(in_stack_ffffffffffffffa8,(char *)0xec8b90);
  iVar3 = SUNLogger_SetWarningFilename(in_stack_ffffffffffffffa8,(char *)0xec8baa);
  iVar4 = SUNLogger_SetDebugFilename(in_stack_ffffffffffffffa8,(char *)0xec8bc4);
  iVar5 = SUNLogger_SetInfoFilename(in_stack_ffffffffffffffa8,(char *)0xec8bde);
  iVar6 = 0;
  if (iVar5 + iVar4 + iVar3 + iVar2 + iVar1 < 0) {
    iVar6 = -1;
  }
  return iVar6;
}

Assistant:

int SUNLogger_CreateFromEnv(void* comm, SUNLogger* logger)
{
  int retval = 0;

  const char* output_rank_env   = getenv("SUNLOGGER_OUTPUT_RANK");
  int output_rank               = (output_rank_env) ? atoi(output_rank_env) : 0;
  const char* error_fname_env   = getenv("SUNLOGGER_ERROR_FILENAME");
  const char* warning_fname_env = getenv("SUNLOGGER_WARNING_FILENAME");
  const char* info_fname_env    = getenv("SUNLOGGER_INFO_FILENAME");
  const char* debug_fname_env   = getenv("SUNLOGGER_DEBUG_FILENAME");

  retval += SUNLogger_Create(comm, output_rank, logger);
  retval += SUNLogger_SetErrorFilename(*logger, error_fname_env);
  retval += SUNLogger_SetWarningFilename(*logger, warning_fname_env);
  retval += SUNLogger_SetDebugFilename(*logger, debug_fname_env);
  retval += SUNLogger_SetInfoFilename(*logger, info_fname_env);

  return (retval < 0) ? -1 : 0;
}